

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikcp.c
# Opt level: O3

void ikcp_release(ikcpcb *kcp)

{
  IQUEUEHEAD *pIVar1;
  IQUEUEHEAD *pIVar2;
  IQUEUEHEAD *pIVar3;
  char *__ptr;
  _func_void_void_ptr *UNRECOVERED_JUMPTABLE;
  _func_void_void_ptr *p_Var4;
  IUINT32 *__ptr_00;
  
  if (kcp == (ikcpcb *)0x0) {
    __assert_fail("kcp",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/3rd/kcp/ikcp.c"
                  ,0x12f,"void ikcp_release(ikcpcb *)");
  }
  pIVar1 = (kcp->snd_buf).next;
  UNRECOVERED_JUMPTABLE = ikcp_free_hook;
  p_Var4 = ikcp_free_hook;
  while (&kcp->snd_buf != pIVar1) {
    pIVar2 = pIVar1->next;
    pIVar3 = pIVar1->prev;
    pIVar2->prev = pIVar3;
    pIVar3->next = pIVar2;
    pIVar1->next = (IQUEUEHEAD *)0x0;
    pIVar1->prev = (IQUEUEHEAD *)0x0;
    if (UNRECOVERED_JUMPTABLE == (_func_void_void_ptr *)0x0) {
      free(pIVar1);
      UNRECOVERED_JUMPTABLE = (_func_void_void_ptr *)0x0;
    }
    else {
      (*UNRECOVERED_JUMPTABLE)(pIVar1);
      UNRECOVERED_JUMPTABLE = ikcp_free_hook;
      p_Var4 = ikcp_free_hook;
    }
    pIVar1 = (kcp->snd_buf).next;
  }
  pIVar1 = (kcp->rcv_buf).next;
  UNRECOVERED_JUMPTABLE = p_Var4;
  while (&kcp->rcv_buf != pIVar1) {
    pIVar2 = pIVar1->next;
    pIVar3 = pIVar1->prev;
    pIVar2->prev = pIVar3;
    pIVar3->next = pIVar2;
    pIVar1->next = (IQUEUEHEAD *)0x0;
    pIVar1->prev = (IQUEUEHEAD *)0x0;
    if (p_Var4 == (_func_void_void_ptr *)0x0) {
      free(pIVar1);
      p_Var4 = (_func_void_void_ptr *)0x0;
    }
    else {
      (*p_Var4)(pIVar1);
      p_Var4 = ikcp_free_hook;
      UNRECOVERED_JUMPTABLE = ikcp_free_hook;
    }
    pIVar1 = (kcp->rcv_buf).next;
  }
  pIVar1 = (kcp->snd_queue).next;
  p_Var4 = UNRECOVERED_JUMPTABLE;
  while (&kcp->snd_queue != pIVar1) {
    pIVar2 = pIVar1->next;
    pIVar3 = pIVar1->prev;
    pIVar2->prev = pIVar3;
    pIVar3->next = pIVar2;
    pIVar1->next = (IQUEUEHEAD *)0x0;
    pIVar1->prev = (IQUEUEHEAD *)0x0;
    if (UNRECOVERED_JUMPTABLE == (_func_void_void_ptr *)0x0) {
      free(pIVar1);
      UNRECOVERED_JUMPTABLE = (_func_void_void_ptr *)0x0;
    }
    else {
      (*UNRECOVERED_JUMPTABLE)(pIVar1);
      UNRECOVERED_JUMPTABLE = ikcp_free_hook;
      p_Var4 = ikcp_free_hook;
    }
    pIVar1 = (kcp->snd_queue).next;
  }
  pIVar1 = (kcp->rcv_queue).next;
  UNRECOVERED_JUMPTABLE = p_Var4;
  while (&kcp->rcv_queue != pIVar1) {
    pIVar2 = pIVar1->next;
    pIVar3 = pIVar1->prev;
    pIVar2->prev = pIVar3;
    pIVar3->next = pIVar2;
    pIVar1->next = (IQUEUEHEAD *)0x0;
    pIVar1->prev = (IQUEUEHEAD *)0x0;
    if (p_Var4 == (_func_void_void_ptr *)0x0) {
      free(pIVar1);
      p_Var4 = (_func_void_void_ptr *)0x0;
    }
    else {
      (*p_Var4)(pIVar1);
      p_Var4 = ikcp_free_hook;
      UNRECOVERED_JUMPTABLE = ikcp_free_hook;
    }
    pIVar1 = (kcp->rcv_queue).next;
  }
  __ptr = kcp->buffer;
  if (__ptr == (char *)0x0) {
LAB_0013398b:
    __ptr_00 = kcp->acklist;
    if (__ptr_00 == (IUINT32 *)0x0) goto LAB_001339c5;
    if (UNRECOVERED_JUMPTABLE != (_func_void_void_ptr *)0x0) {
      (*UNRECOVERED_JUMPTABLE)(__ptr_00);
      UNRECOVERED_JUMPTABLE = ikcp_free_hook;
      goto LAB_001339c5;
    }
LAB_001339be:
    free(__ptr_00);
  }
  else {
    if (UNRECOVERED_JUMPTABLE != (_func_void_void_ptr *)0x0) {
      (*UNRECOVERED_JUMPTABLE)(__ptr);
      UNRECOVERED_JUMPTABLE = ikcp_free_hook;
      goto LAB_0013398b;
    }
    free(__ptr);
    __ptr_00 = kcp->acklist;
    if (__ptr_00 != (IUINT32 *)0x0) goto LAB_001339be;
  }
  UNRECOVERED_JUMPTABLE = (_func_void_void_ptr *)0x0;
LAB_001339c5:
  kcp->ackcount = 0;
  kcp->buffer = (char *)0x0;
  kcp->nrcv_buf = 0;
  kcp->nsnd_buf = 0;
  kcp->nrcv_que = 0;
  kcp->nsnd_que = 0;
  kcp->acklist = (IUINT32 *)0x0;
  if (UNRECOVERED_JUMPTABLE == (_func_void_void_ptr *)0x0) {
    free(kcp);
    return;
  }
  (*UNRECOVERED_JUMPTABLE)(kcp);
  return;
}

Assistant:

void ikcp_release(ikcpcb *kcp)
{
	assert(kcp);
	if (kcp) {
		IKCPSEG *seg;
		while (!iqueue_is_empty(&kcp->snd_buf)) {
			seg = iqueue_entry(kcp->snd_buf.next, IKCPSEG, node);
			iqueue_del(&seg->node);
			ikcp_segment_delete(kcp, seg);
		}
		while (!iqueue_is_empty(&kcp->rcv_buf)) {
			seg = iqueue_entry(kcp->rcv_buf.next, IKCPSEG, node);
			iqueue_del(&seg->node);
			ikcp_segment_delete(kcp, seg);
		}
		while (!iqueue_is_empty(&kcp->snd_queue)) {
			seg = iqueue_entry(kcp->snd_queue.next, IKCPSEG, node);
			iqueue_del(&seg->node);
			ikcp_segment_delete(kcp, seg);
		}
		while (!iqueue_is_empty(&kcp->rcv_queue)) {
			seg = iqueue_entry(kcp->rcv_queue.next, IKCPSEG, node);
			iqueue_del(&seg->node);
			ikcp_segment_delete(kcp, seg);
		}
		if (kcp->buffer) {
			ikcp_free(kcp->buffer);
		}
		if (kcp->acklist) {
			ikcp_free(kcp->acklist);
		}

		kcp->nrcv_buf = 0;
		kcp->nsnd_buf = 0;
		kcp->nrcv_que = 0;
		kcp->nsnd_que = 0;
		kcp->ackcount = 0;
		kcp->buffer = NULL;
		kcp->acklist = NULL;
		ikcp_free(kcp);
	}
}